

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

double TasGrid::Optimizer::getDerivative<(TasGrid::TypeOneDRule)20>
                 (CurrentNodes<(TasGrid::TypeOneDRule)20> *current,double x)

{
  vector<double,_std::allocator<double>_> *coeffs;
  double dVar1;
  size_t i;
  size_t inode;
  double dVar2;
  double dVar3;
  double dVar4;
  vector<double,_std::allocator<double>_> lag_less1;
  vector<double,_std::allocator<double>_> lag;
  double local_88;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  coeffs = &current->coeff;
  evalLagrange((vector<double,_std::allocator<double>_> *)&local_48,&current->nodes,coeffs,x);
  evalLagrange((vector<double,_std::allocator<double>_> *)&local_60,&current->nodes_less1,
               &current->coeff_less1,x);
  local_88 = 0.0;
  for (inode = 0;
      (long)local_60._M_impl.super__Vector_impl_data._M_finish -
      (long)local_60._M_impl.super__Vector_impl_data._M_start >> 3 != inode; inode = inode + 1) {
    dVar1 = local_48._M_impl.super__Vector_impl_data._M_start[inode];
    dVar4 = local_60._M_impl.super__Vector_impl_data._M_start[inode];
    dVar2 = differentiateBasis(&current->nodes,coeffs,inode,x);
    dVar3 = differentiateBasis(&current->nodes_less1,&current->coeff_less1,inode,x);
    local_88 = local_88 +
               (dVar2 - dVar3) * *(double *)(&DAT_001cb090 + (ulong)(0.0 <= dVar1 - dVar4) * 8);
  }
  dVar1 = local_48._M_impl.super__Vector_impl_data._M_finish[-1];
  dVar4 = differentiateBasis(&current->nodes,coeffs,
                             ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3) - 1,x);
  dVar1 = *(double *)(&DAT_001cb090 + (ulong)(0.0 <= dVar1) * 8);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return dVar4 * dVar1 + local_88;
}

Assistant:

double getDerivative<rule_mindeltaodd>(CurrentNodes<rule_mindeltaodd> const& current, double x){
    auto lag       = evalLagrange(current.nodes,       current.coeff,       x);
    auto lag_less1 = evalLagrange(current.nodes_less1, current.coeff_less1, x);

    double sum = 0.0;
    for(size_t i=0; i<lag_less1.size(); i++){
        sum += Maths::sign(lag[i] - lag_less1[i])
                * (differentiateBasis(current.nodes,        current.coeff,       i, x)
                   - differentiateBasis(current.nodes_less1, current.coeff_less1, i, x));
    }
    return sum + Maths::sign(lag.back()) * differentiateBasis(current.nodes, current.coeff, lag.size() - 1, x);
}